

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_edge.c
# Opt level: O2

REF_STATUS ref_edge_with(REF_EDGE ref_edge,REF_INT node0,REF_INT node1,REF_INT *edge)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  REF_ADJ pRVar4;
  REF_ADJ_ITEM pRVar5;
  REF_INT RVar6;
  ulong uVar7;
  
  *edge = -1;
  RVar6 = -1;
  uVar7 = 0xffffffff;
  if (-1 < node0) {
    pRVar4 = ref_edge->adj;
    uVar7 = 0xffffffff;
    RVar6 = -1;
    if (node0 < pRVar4->nnode) {
      uVar1 = pRVar4->first[(uint)node0];
      uVar7 = 0xffffffff;
      RVar6 = -1;
      if ((long)(int)uVar1 != -1) {
        RVar6 = pRVar4->item[(int)uVar1].ref;
        uVar7 = (ulong)uVar1;
      }
    }
  }
  while( true ) {
    if ((int)uVar7 == -1) {
      return 5;
    }
    iVar2 = ref_edge->e2n[RVar6 * 2];
    iVar3 = ref_edge->e2n[RVar6 * 2 + 1];
    if ((iVar3 == node1 && iVar2 == node0) || (iVar3 == node0 && iVar2 == node1)) break;
    pRVar5 = ref_edge->adj->item;
    uVar7 = (ulong)pRVar5[(int)uVar7].next;
    RVar6 = -1;
    if (uVar7 != 0xffffffffffffffff) {
      RVar6 = pRVar5[uVar7].ref;
    }
  }
  *edge = RVar6;
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_edge_with(REF_EDGE ref_edge, REF_INT node0,
                                 REF_INT node1, REF_INT *edge) {
  REF_INT item, ref;
  REF_INT n0, n1;

  *edge = REF_EMPTY;

  each_ref_adj_node_item_with_ref(ref_edge_adj(ref_edge), node0, item, ref) {
    n0 = ref_edge_e2n(ref_edge, 0, ref);
    n1 = ref_edge_e2n(ref_edge, 1, ref);
    if ((n0 == node0 && n1 == node1) || (n0 == node1 && n1 == node0)) {
      *edge = ref;
      return REF_SUCCESS;
    }
  }

  return REF_NOT_FOUND;
}